

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hash.cc
# Opt level: O3

uchar * __thiscall phosg::SHA1::SHA1(SHA1 *this,uchar *d,size_t n,uchar *md)

{
  long lVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  undefined1 auVar20 [15];
  uint uVar21;
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  uint uVar33;
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  uint uVar41;
  size_t x;
  long lVar42;
  size_t sVar43;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar44;
  uint uVar45;
  uint uVar46;
  uint uVar47;
  uint uVar48;
  int iVar49;
  uint uVar50;
  uint uVar51;
  long lVar52;
  uint32_t uVar53;
  uint uVar54;
  size_t x_3;
  ulong uVar55;
  uint uVar56;
  size_t z;
  uint32_t uVar57;
  size_t x_1;
  ulong uVar58;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  StringWriter w;
  uint auStack_1b8 [4];
  size_t local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  uchar *local_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  uint auStack_138 [66];
  
  this->h[0] = 0x67452301;
  this->h[1] = 0xefcdab89;
  this->h[2] = 0x98badcfe;
  this->h[3] = 0x10325476;
  this->h[4] = 0xc3d2e1f0;
  if (n < 0x40) {
    lVar42 = 0;
  }
  else {
    uVar46 = 0x98badcfe;
    uVar50 = 0xefcdab89;
    uVar51 = 0x67452301;
    lVar52 = 0;
    uVar45 = 0xc3d2e1f0;
    uVar54 = 0x10325476;
    do {
      auStack_1b8[2] = uVar54;
      auStack_1b8[3] = uVar45;
      local_148 = *(undefined8 *)(d + lVar52 + 0x30);
      uStack_140 = *(undefined8 *)(d + lVar52 + 0x30 + 8);
      local_158 = *(undefined8 *)(d + lVar52 + 0x20);
      uStack_150 = *(undefined8 *)(d + lVar52 + 0x20 + 8);
      local_168 = *(undefined8 *)(d + lVar52 + 0x10);
      uStack_160 = *(undefined8 *)(d + lVar52 + 0x10 + 8);
      local_178 = *(undefined8 *)(d + lVar52);
      uStack_170 = *(undefined8 *)(d + lVar52 + 8);
      lVar42 = 0;
      do {
        auVar60 = *(undefined1 (*) [16])((long)&local_178 + lVar42 * 4);
        auVar62[1] = 0;
        auVar62[0] = auVar60[8];
        auVar62[2] = auVar60[9];
        auVar62[3] = 0;
        auVar62[4] = auVar60[10];
        auVar62[5] = 0;
        auVar62[6] = auVar60[0xb];
        auVar62[7] = 0;
        auVar62[8] = auVar60[0xc];
        auVar62[9] = 0;
        auVar62[10] = auVar60[0xd];
        auVar62[0xb] = 0;
        auVar62[0xc] = auVar60[0xe];
        auVar62[0xd] = 0;
        auVar62[0xe] = auVar60[0xf];
        auVar62[0xf] = 0;
        auVar62 = pshuflw(auVar62,auVar62,0x1b);
        auVar62 = pshufhw(auVar62,auVar62,0x1b);
        auVar20[0xd] = 0;
        auVar20._0_13_ = auVar60._0_13_;
        auVar20[0xe] = auVar60[7];
        auVar22[0xc] = auVar60[6];
        auVar22._0_12_ = auVar60._0_12_;
        auVar22._13_2_ = auVar20._13_2_;
        auVar24[0xb] = 0;
        auVar24._0_11_ = auVar60._0_11_;
        auVar24._12_3_ = auVar22._12_3_;
        auVar26[10] = auVar60[5];
        auVar26._0_10_ = auVar60._0_10_;
        auVar26._11_4_ = auVar24._11_4_;
        auVar28[9] = 0;
        auVar28._0_9_ = auVar60._0_9_;
        auVar28._10_5_ = auVar26._10_5_;
        auVar30[8] = auVar60[4];
        auVar30._0_8_ = auVar60._0_8_;
        auVar30._9_6_ = auVar28._9_6_;
        auVar35._7_8_ = 0;
        auVar35._0_7_ = auVar30._8_7_;
        auVar37._1_8_ = SUB158(auVar35 << 0x40,7);
        auVar37[0] = auVar60[3];
        auVar37._9_6_ = 0;
        auVar38._1_10_ = SUB1510(auVar37 << 0x30,5);
        auVar38[0] = auVar60[2];
        auVar38._11_4_ = 0;
        auVar34[2] = auVar60[1];
        auVar34._0_2_ = auVar60._0_2_;
        auVar34._3_12_ = SUB1512(auVar38 << 0x20,3);
        auVar60._0_2_ = auVar60._0_2_ & 0xff;
        auVar60._2_13_ = auVar34._2_13_;
        auVar60[0xf] = 0;
        auVar60 = pshuflw(auVar60,auVar60,0x1b);
        auVar60 = pshufhw(auVar60,auVar60,0x1b);
        sVar4 = auVar60._0_2_;
        sVar5 = auVar60._2_2_;
        sVar6 = auVar60._4_2_;
        sVar7 = auVar60._6_2_;
        sVar8 = auVar60._8_2_;
        sVar9 = auVar60._10_2_;
        sVar10 = auVar60._12_2_;
        sVar11 = auVar60._14_2_;
        sVar12 = auVar62._0_2_;
        sVar13 = auVar62._2_2_;
        sVar14 = auVar62._4_2_;
        sVar15 = auVar62._6_2_;
        sVar16 = auVar62._8_2_;
        sVar17 = auVar62._10_2_;
        sVar18 = auVar62._12_2_;
        sVar19 = auVar62._14_2_;
        lVar1 = lVar42 * 4;
        *(char *)((long)&local_178 + lVar1) =
             (0 < sVar4) * (sVar4 < 0x100) * auVar60[0] - (0xff < sVar4);
        *(char *)((long)&local_178 + lVar1 + 1) =
             (0 < sVar5) * (sVar5 < 0x100) * auVar60[2] - (0xff < sVar5);
        *(char *)((long)&local_178 + lVar1 + 2) =
             (0 < sVar6) * (sVar6 < 0x100) * auVar60[4] - (0xff < sVar6);
        *(char *)((long)&local_178 + lVar1 + 3) =
             (0 < sVar7) * (sVar7 < 0x100) * auVar60[6] - (0xff < sVar7);
        *(char *)((long)&local_178 + lVar1 + 4) =
             (0 < sVar8) * (sVar8 < 0x100) * auVar60[8] - (0xff < sVar8);
        *(char *)((long)&local_178 + lVar1 + 5) =
             (0 < sVar9) * (sVar9 < 0x100) * auVar60[10] - (0xff < sVar9);
        *(char *)((long)&local_178 + lVar1 + 6) =
             (0 < sVar10) * (sVar10 < 0x100) * auVar60[0xc] - (0xff < sVar10);
        *(char *)((long)&local_178 + lVar1 + 7) =
             (0 < sVar11) * (sVar11 < 0x100) * auVar60[0xe] - (0xff < sVar11);
        *(char *)((long)&uStack_170 + lVar1) =
             (0 < sVar12) * (sVar12 < 0x100) * auVar62[0] - (0xff < sVar12);
        *(char *)((long)&uStack_170 + lVar1 + 1) =
             (0 < sVar13) * (sVar13 < 0x100) * auVar62[2] - (0xff < sVar13);
        *(char *)((long)&uStack_170 + lVar1 + 2) =
             (0 < sVar14) * (sVar14 < 0x100) * auVar62[4] - (0xff < sVar14);
        *(char *)((long)&uStack_170 + lVar1 + 3) =
             (0 < sVar15) * (sVar15 < 0x100) * auVar62[6] - (0xff < sVar15);
        *(char *)((long)&uStack_170 + lVar1 + 4) =
             (0 < sVar16) * (sVar16 < 0x100) * auVar62[8] - (0xff < sVar16);
        *(char *)((long)&uStack_170 + lVar1 + 5) =
             (0 < sVar17) * (sVar17 < 0x100) * auVar62[10] - (0xff < sVar17);
        *(char *)((long)&uStack_170 + lVar1 + 6) =
             (0 < sVar18) * (sVar18 < 0x100) * auVar62[0xc] - (0xff < sVar18);
        *(char *)((long)&uStack_170 + lVar1 + 7) =
             (0 < sVar19) * (sVar19 < 0x100) * auVar62[0xe] - (0xff < sVar19);
        lVar42 = lVar42 + 4;
      } while (lVar42 != 0x10);
      lVar42 = 0x10;
      do {
        uVar45 = *(uint *)((long)&local_1a0._M_string_length + lVar42 * 4) ^
                 *(uint *)((long)&local_1a0.field_2 + lVar42 * 4 + 0xc) ^ auStack_1b8[lVar42 + 2] ^
                 auStack_1b8[lVar42];
        *(uint *)((long)&local_178 + lVar42 * 4) = uVar45 << 1 | (uint)((int)uVar45 < 0);
        lVar42 = lVar42 + 1;
      } while (lVar42 != 0x50);
      uVar58 = 0;
      uVar45 = auStack_1b8[3];
      uVar54 = auStack_1b8[2];
      uVar41 = uVar50;
      uVar56 = uVar51;
      uVar47 = uVar46;
      do {
        uVar33 = uVar47;
        uVar21 = uVar56;
        uVar48 = uVar54;
        if (uVar58 < 0x14) {
          uVar54 = (uVar33 ^ uVar48) & uVar41 ^ uVar48;
          iVar49 = 0x5a827999;
        }
        else if (uVar58 < 0x28) {
          uVar54 = uVar33 ^ uVar48 ^ uVar41;
          iVar49 = 0x6ed9eba1;
        }
        else if (uVar58 < 0x3c) {
          uVar54 = uVar33 & uVar48 | (uVar33 | uVar48) & uVar41;
          iVar49 = -0x70e44324;
        }
        else {
          uVar54 = uVar33 ^ uVar48 ^ uVar41;
          iVar49 = -0x359d3e2a;
        }
        uVar56 = (uVar21 << 5 | uVar21 >> 0x1b) + uVar45 + uVar54 + iVar49 +
                 *(int *)((long)&local_178 + uVar58 * 4);
        uVar47 = uVar41 << 0x1e | uVar41 >> 2;
        uVar58 = uVar58 + 1;
        uVar45 = uVar48;
        uVar54 = uVar33;
        uVar41 = uVar21;
      } while (uVar58 != 0x50);
      uVar51 = uVar51 + uVar56;
      this->h[0] = uVar51;
      uVar50 = uVar50 + uVar21;
      this->h[1] = uVar50;
      uVar46 = uVar46 + uVar47;
      this->h[2] = uVar46;
      this->h[3] = auStack_1b8[2] + uVar33;
      this->h[4] = auStack_1b8[3] + uVar48;
      lVar42 = lVar52 + 0x40;
      uVar58 = lVar52 + 0x7f;
      lVar52 = lVar42;
      uVar45 = auStack_1b8[3] + uVar48;
      uVar54 = auStack_1b8[2] + uVar33;
    } while (uVar58 < n);
  }
  local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
  local_1a0._M_string_length = 0;
  local_1a0.field_2._M_local_buf[0] = '\0';
  local_1a8 = n;
  local_180 = d;
  StringWriter::write((StringWriter *)&local_1a0,(int)d + (int)lVar42,(void *)(n - lVar42),
                      (size_t)local_1a0._M_dataplus._M_p);
  local_178 = CONCAT71(local_178._1_7_,0x80);
  ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (&local_1a0,(char *)&local_178,1);
  sVar43 = StringWriter::size((StringWriter *)&local_1a0);
  ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
            (&local_1a0,(ulong)(0x38 < sVar43) * 0x40 + 0x40,'\0');
  sVar43 = StringWriter::size((StringWriter *)&local_1a0);
  if (local_1a0._M_string_length < sVar43) {
    ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
              (&local_1a0,sVar43,'\0');
  }
  uVar58 = local_1a8 << 3;
  *(ulong *)(local_1a0._M_dataplus._M_p + (sVar43 - 8)) =
       uVar58 >> 0x38 | (uVar58 & 0xff000000000000) >> 0x28 | (uVar58 & 0xff0000000000) >> 0x18 |
       (uVar58 & 0xff00000000) >> 8 | (uVar58 & 0xff000000) << 8 | (uVar58 & 0xff0000) << 0x18 |
       (uVar58 & 0xff00) << 0x28 | local_1a8 << 0x3b;
  for (uVar58 = 0; sVar43 = StringWriter::size((StringWriter *)&local_1a0), uVar58 < sVar43;
      uVar58 = uVar58 + 0x40) {
    local_148 = *(undefined8 *)(local_1a0._M_dataplus._M_p + uVar58 + 0x30);
    uStack_140 = *(undefined8 *)(local_1a0._M_dataplus._M_p + uVar58 + 0x30 + 8);
    local_158 = *(undefined8 *)(local_1a0._M_dataplus._M_p + uVar58 + 0x20);
    uStack_150 = *(undefined8 *)(local_1a0._M_dataplus._M_p + uVar58 + 0x20 + 8);
    local_168 = *(undefined8 *)(local_1a0._M_dataplus._M_p + uVar58 + 0x10);
    uStack_160 = *(undefined8 *)(local_1a0._M_dataplus._M_p + uVar58 + 0x10 + 8);
    local_178 = *(undefined8 *)(local_1a0._M_dataplus._M_p + uVar58);
    uStack_170 = *(undefined8 *)(local_1a0._M_dataplus._M_p + uVar58 + 8);
    lVar42 = 0;
    do {
      auVar60 = *(undefined1 (*) [16])((long)&local_178 + lVar42 * 4);
      auVar61[1] = 0;
      auVar61[0] = auVar60[8];
      auVar61[2] = auVar60[9];
      auVar61[3] = 0;
      auVar61[4] = auVar60[10];
      auVar61[5] = 0;
      auVar61[6] = auVar60[0xb];
      auVar61[7] = 0;
      auVar61[8] = auVar60[0xc];
      auVar61[9] = 0;
      auVar61[10] = auVar60[0xd];
      auVar61[0xb] = 0;
      auVar61[0xc] = auVar60[0xe];
      auVar61[0xd] = 0;
      auVar61[0xe] = auVar60[0xf];
      auVar61[0xf] = 0;
      auVar62 = pshuflw(auVar61,auVar61,0x1b);
      auVar62 = pshufhw(auVar62,auVar62,0x1b);
      auVar23[0xd] = 0;
      auVar23._0_13_ = auVar60._0_13_;
      auVar23[0xe] = auVar60[7];
      auVar25[0xc] = auVar60[6];
      auVar25._0_12_ = auVar60._0_12_;
      auVar25._13_2_ = auVar23._13_2_;
      auVar27[0xb] = 0;
      auVar27._0_11_ = auVar60._0_11_;
      auVar27._12_3_ = auVar25._12_3_;
      auVar29[10] = auVar60[5];
      auVar29._0_10_ = auVar60._0_10_;
      auVar29._11_4_ = auVar27._11_4_;
      auVar31[9] = 0;
      auVar31._0_9_ = auVar60._0_9_;
      auVar31._10_5_ = auVar29._10_5_;
      auVar32[8] = auVar60[4];
      auVar32._0_8_ = auVar60._0_8_;
      auVar32._9_6_ = auVar31._9_6_;
      auVar36._7_8_ = 0;
      auVar36._0_7_ = auVar32._8_7_;
      auVar39._1_8_ = SUB158(auVar36 << 0x40,7);
      auVar39[0] = auVar60[3];
      auVar39._9_6_ = 0;
      auVar40._1_10_ = SUB1510(auVar39 << 0x30,5);
      auVar40[0] = auVar60[2];
      auVar40._11_4_ = 0;
      auVar59._3_12_ = SUB1512(auVar40 << 0x20,3);
      auVar59[2] = auVar60[1];
      auVar59[0] = auVar60[0];
      auVar59[1] = 0;
      auVar59[0xf] = 0;
      auVar60 = pshuflw(auVar59,auVar59,0x1b);
      auVar60 = pshufhw(auVar60,auVar60,0x1b);
      sVar4 = auVar60._0_2_;
      sVar5 = auVar60._2_2_;
      sVar6 = auVar60._4_2_;
      sVar7 = auVar60._6_2_;
      sVar8 = auVar60._8_2_;
      sVar9 = auVar60._10_2_;
      sVar10 = auVar60._12_2_;
      sVar11 = auVar60._14_2_;
      sVar12 = auVar62._0_2_;
      sVar13 = auVar62._2_2_;
      sVar14 = auVar62._4_2_;
      sVar15 = auVar62._6_2_;
      sVar16 = auVar62._8_2_;
      sVar17 = auVar62._10_2_;
      sVar18 = auVar62._12_2_;
      sVar19 = auVar62._14_2_;
      lVar52 = lVar42 * 4;
      *(char *)((long)&local_178 + lVar52) =
           (0 < sVar4) * (sVar4 < 0x100) * auVar60[0] - (0xff < sVar4);
      *(char *)((long)&local_178 + lVar52 + 1) =
           (0 < sVar5) * (sVar5 < 0x100) * auVar60[2] - (0xff < sVar5);
      *(char *)((long)&local_178 + lVar52 + 2) =
           (0 < sVar6) * (sVar6 < 0x100) * auVar60[4] - (0xff < sVar6);
      *(char *)((long)&local_178 + lVar52 + 3) =
           (0 < sVar7) * (sVar7 < 0x100) * auVar60[6] - (0xff < sVar7);
      *(char *)((long)&local_178 + lVar52 + 4) =
           (0 < sVar8) * (sVar8 < 0x100) * auVar60[8] - (0xff < sVar8);
      *(char *)((long)&local_178 + lVar52 + 5) =
           (0 < sVar9) * (sVar9 < 0x100) * auVar60[10] - (0xff < sVar9);
      *(char *)((long)&local_178 + lVar52 + 6) =
           (0 < sVar10) * (sVar10 < 0x100) * auVar60[0xc] - (0xff < sVar10);
      *(char *)((long)&local_178 + lVar52 + 7) =
           (0 < sVar11) * (sVar11 < 0x100) * auVar60[0xe] - (0xff < sVar11);
      *(char *)((long)&uStack_170 + lVar52) =
           (0 < sVar12) * (sVar12 < 0x100) * auVar62[0] - (0xff < sVar12);
      *(char *)((long)&uStack_170 + lVar52 + 1) =
           (0 < sVar13) * (sVar13 < 0x100) * auVar62[2] - (0xff < sVar13);
      *(char *)((long)&uStack_170 + lVar52 + 2) =
           (0 < sVar14) * (sVar14 < 0x100) * auVar62[4] - (0xff < sVar14);
      *(char *)((long)&uStack_170 + lVar52 + 3) =
           (0 < sVar15) * (sVar15 < 0x100) * auVar62[6] - (0xff < sVar15);
      *(char *)((long)&uStack_170 + lVar52 + 4) =
           (0 < sVar16) * (sVar16 < 0x100) * auVar62[8] - (0xff < sVar16);
      *(char *)((long)&uStack_170 + lVar52 + 5) =
           (0 < sVar17) * (sVar17 < 0x100) * auVar62[10] - (0xff < sVar17);
      *(char *)((long)&uStack_170 + lVar52 + 6) =
           (0 < sVar18) * (sVar18 < 0x100) * auVar62[0xc] - (0xff < sVar18);
      *(char *)((long)&uStack_170 + lVar52 + 7) =
           (0 < sVar19) * (sVar19 < 0x100) * auVar62[0xe] - (0xff < sVar19);
      lVar42 = lVar42 + 4;
    } while (lVar42 != 0x10);
    lVar42 = 0x10;
    do {
      uVar45 = *(uint *)((long)&local_1a0._M_string_length + lVar42 * 4) ^
               *(uint *)((long)&local_1a0.field_2 + lVar42 * 4 + 0xc) ^ auStack_1b8[lVar42 + 2] ^
               auStack_1b8[lVar42];
      *(uint *)((long)&local_178 + lVar42 * 4) = uVar45 << 1 | (uint)((int)uVar45 < 0);
      lVar42 = lVar42 + 1;
    } while (lVar42 != 0x50);
    uVar2 = this->h[1];
    uVar3 = this->h[2];
    auStack_1b8[2] = this->h[3];
    auStack_1b8[3] = this->h[4];
    uVar55 = 0;
    uVar45 = auStack_1b8[2];
    uVar54 = auStack_1b8[3];
    uVar53 = uVar3;
    uVar57 = uVar2;
    uVar46 = this->h[0];
    do {
      uVar51 = uVar46;
      uVar41 = uVar53;
      uVar50 = uVar45;
      if (uVar55 < 0x14) {
        uVar45 = (uVar41 ^ uVar50) & uVar57 ^ uVar50;
        iVar49 = 0x5a827999;
      }
      else if (uVar55 < 0x28) {
        uVar45 = uVar41 ^ uVar50 ^ uVar57;
        iVar49 = 0x6ed9eba1;
      }
      else if (uVar55 < 0x3c) {
        uVar45 = uVar41 & uVar50 | (uVar41 | uVar50) & uVar57;
        iVar49 = -0x70e44324;
      }
      else {
        uVar45 = uVar41 ^ uVar50 ^ uVar57;
        iVar49 = -0x359d3e2a;
      }
      uVar46 = (uVar51 << 5 | uVar51 >> 0x1b) + uVar54 + uVar45 + iVar49 +
               *(int *)((long)&local_178 + uVar55 * 4);
      uVar53 = uVar57 << 0x1e | uVar57 >> 2;
      uVar55 = uVar55 + 1;
      uVar45 = uVar41;
      uVar54 = uVar50;
      uVar57 = uVar51;
    } while (uVar55 != 0x50);
    this->h[0] = uVar46 + this->h[0];
    this->h[1] = uVar51 + uVar2;
    this->h[2] = uVar53 + uVar3;
    this->h[3] = uVar41 + auStack_1b8[2];
    this->h[4] = uVar50 + auStack_1b8[3];
  }
  paVar44 = &local_1a0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != paVar44) {
    operator_delete(local_1a0._M_dataplus._M_p,
                    CONCAT71(local_1a0.field_2._M_allocated_capacity._1_7_,
                             local_1a0.field_2._M_local_buf[0]) + 1);
    paVar44 = extraout_RAX;
  }
  return (uchar *)paVar44;
}

Assistant:

SHA1::SHA1(const void* data, size_t size) {
  this->h[0] = 0x67452301;
  this->h[1] = 0xEFCDAB89;
  this->h[2] = 0x98BADCFE;
  this->h[3] = 0x10325476;
  this->h[4] = 0xC3D2E1F0;

  auto process_block = [this](const void* block) -> void {
    uint32_t extended_fields[80];
    memcpy(extended_fields, block, 0x40);
#ifdef PHOSG_LITTLE_ENDIAN
    for (size_t x = 0; x < 16; x++) {
      extended_fields[x] = bswap32(extended_fields[x]);
    }
#endif

    for (size_t x = 16; x < 80; x++) {
      uint32_t z = extended_fields[x - 3] ^ extended_fields[x - 8] ^ extended_fields[x - 14] ^ extended_fields[x - 16];
      extended_fields[x] = (z << 1) | ((z >> 31) & 1);
    }

    uint32_t a = this->h[0], b = this->h[1], c = this->h[2], d = this->h[3], e = this->h[4];
    for (size_t x = 0; x < 80; x++) {
      uint32_t f, k;
      if (x < 20) {
        f = (b & c) | ((~b) & d);
        k = 0x5A827999;
      } else if (x < 40) {
        f = b ^ c ^ d;
        k = 0x6ED9EBA1;
      } else if (x < 60) {
        f = (b & c) | (b & d) | (c & d);
        k = 0x8F1BBCDC;
      } else {
        f = b ^ c ^ d;
        k = 0xCA62C1D6;
      }

      uint32_t new_a = ((a << 5) | ((a >> 27) & 0x1F)) + f + e + k + extended_fields[x];
      e = d;
      d = c;
      c = (b << 30) | ((b >> 2) & 0x3FFFFFFF);
      b = a;
      a = new_a;
    }

    this->h[0] += a;
    this->h[1] += b;
    this->h[2] += c;
    this->h[3] += d;
    this->h[4] += e;
  };

  // Process all possible blocks from the input until just before the end
  size_t processed_offset;
  for (processed_offset = 0; processed_offset + 0x3F < size; processed_offset += 0x40) {
    process_block(reinterpret_cast<const uint8_t*>(data) + processed_offset);
  }

  // Make a copy of the last (possibly incomplete) block, append the trailer,
  // and process what remains. This could result in either one or two blocks.
  StringWriter w;
  w.write(reinterpret_cast<const char*>(data) + processed_offset, size - processed_offset);
  {
    w.put_u8(0x80);
    w.extend_to((w.size() > 0x38) ? 0x80 : 0x40, '\0');
    w.pput_u64b(w.size() - 8, size << 3);
  }
  for (size_t z = 0; z < w.size(); z += 0x40) {
    process_block(w.str().data() + z);
  }
}